

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmJoin<cmGraphEdgeList>
                   (string *__return_storage_ptr__,cmGraphEdgeList *rng,string_view separator)

{
  pointer pcVar1;
  ostream *this;
  pointer pcVar2;
  ostringstream os;
  undefined1 auStack_1a8 [376];
  
  if ((rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1a8);
    pcVar2 = (rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar1 = (rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::ostream::operator<<(auStack_1a8,pcVar2->Dest);
    while (pcVar2 = pcVar2 + 1, pcVar2 != pcVar1) {
      this = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)auStack_1a8,separator._M_str,separator._M_len);
      std::ostream::operator<<(this,pcVar2->Dest);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1a8);
    std::ios_base::~ios_base((ios_base *)(auStack_1a8 + 0x70));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}